

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

bool __thiscall crnlib::rg_etc1::etc1_optimizer::compute(etc1_optimizer *this)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  params *ppVar9;
  results *prVar10;
  undefined1 auVar11 [16];
  int iVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint refinement_trial;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar29;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar31;
  undefined1 auVar30 [16];
  int iVar32;
  int iVar33;
  float fVar34;
  float fVar35;
  int iVar37;
  float fVar38;
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  etc1_solution_coordinates coords1;
  etc1_solution_coordinates coords;
  uint local_bc;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_b8;
  undefined4 local_b4;
  undefined1 local_b0;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_ac;
  undefined4 local_a8;
  undefined1 local_a4;
  potential_solution *local_a0;
  potential_solution *local_98;
  long local_90;
  long local_88;
  long local_80;
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  uint local_64;
  long local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  undefined4 uStack_40;
  
  uVar6 = this->m_pParams->m_num_src_pixels;
  local_80 = (long)(int)this->m_pParams->m_scan_delta_size;
  if (0 < local_80) {
    local_98 = &this->m_trial_solution;
    local_a0 = &this->m_best_solution;
    local_58 = (float)uVar6;
    uStack_40 = 0;
    local_90 = 0;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    local_48 = local_58;
    do {
      local_74 = this->m_pParams->m_pScan_deltas[local_90];
      uVar14 = this->m_bb + local_74;
      if (-1 < (int)uVar14) {
        if (this->m_limit < (int)uVar14) break;
        local_70 = 0xff;
        if (uVar14 < 0xff) {
          local_70 = uVar14;
        }
        local_88 = 0;
        do {
          iVar12 = local_74;
          iVar7 = this->m_pParams->m_pScan_deltas[local_88];
          uVar15 = this->m_bg + iVar7;
          if (-1 < (int)uVar15) {
            if (this->m_limit < (int)uVar15) break;
            local_6c = 0xff;
            if (uVar15 < 0xff) {
              local_6c = uVar15;
            }
            lVar20 = 0;
            do {
              ppVar9 = this->m_pParams;
              iVar17 = ppVar9->m_pScan_deltas[lVar20];
              uVar22 = this->m_br + iVar17;
              if (-1 < (int)uVar22) {
                if (this->m_limit < (int)uVar22) break;
                local_a4 = ppVar9->m_use_color4;
                uVar16 = 0xff;
                if (uVar22 < 0xff) {
                  uVar16 = uVar22;
                }
                local_ac.field_0.r = (component_t)uVar16;
                local_ac.field_0.g = (component_t)local_6c;
                local_ac.field_0.b = (component_t)local_70;
                local_ac.field_0.a = 0xff;
                local_a8 = 0;
                local_60 = lVar20;
                if ((ppVar9->super_etc1_pack_params).m_quality == cHighQuality) {
                  bVar13 = evaluate_solution(this,(etc1_solution_coordinates *)&local_ac.field_0,
                                             local_98,local_a0);
                }
                else {
                  bVar13 = evaluate_solution_fast
                                     (this,(etc1_solution_coordinates *)&local_ac.field_0,local_98,
                                      local_a0);
                }
                lVar20 = local_60;
                if (bVar13 != false) {
                  bVar13 = iVar17 == 0 && (iVar7 == 0 && iVar12 == 0);
                  local_68 = bVar13 + 2 + (uint)bVar13;
                  if ((this->m_pParams->super_etc1_pack_params).m_quality == cLowQuality) {
                    local_68 = 2;
                  }
                  iVar17 = 0;
                  while( true ) {
                    bVar4 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.r;
                    local_64 = (uint)bVar4;
                    if ((this->m_best_solution).m_coords.m_color4 == true) {
                      bVar5 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.g;
                      uVar16 = (uint)bVar5;
                      auVar30._0_4_ = (uint)bVar4 << 4;
                      auVar30._4_4_ = (uint)bVar5 << 4;
                      auVar30._8_8_ = 0;
                      auVar30 = auVar30 | ZEXT516(CONCAT14(bVar5,(uint)bVar4));
                      bVar4 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b;
                      uVar18 = (uint)bVar4 << 4 | (uint)bVar4;
                    }
                    else {
                      bVar5 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.g;
                      auVar24._0_4_ = local_64 << 3;
                      auVar24._4_4_ = (uint)bVar5 << 3;
                      auVar24._8_8_ = 0;
                      auVar30 = auVar24 | ZEXT516(CONCAT14(bVar5 >> 2,(uint)(bVar4 >> 2)));
                      bVar4 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b;
                      uVar16 = (uint)(bVar4 >> 2);
                      uVar18 = (uint)bVar4 << 3 | uVar16;
                    }
                    local_bc = (uint)bVar5;
                    if (0xfe < uVar18) {
                      uVar18 = 0xff;
                    }
                    if (uVar6 == 0) {
                      iVar19 = 0;
                      iVar33 = 0;
                      iVar37 = 0;
                      iVar31 = 0;
                      iVar32 = 0;
                    }
                    else {
                      auVar24 = auVar30 ^ _DAT_001a7020;
                      auVar25._0_4_ = -(uint)(-0x7fffff02 < auVar24._0_4_);
                      auVar25._4_4_ = -(uint)(-0x7fffff02 < auVar24._4_4_);
                      auVar25._8_4_ = -(uint)(0 < auVar24._8_4_);
                      auVar25._12_4_ = -(uint)(0 < auVar24._12_4_);
                      auVar26._0_4_ = auVar25._0_4_ >> 0x18;
                      auVar26._4_4_ = auVar25._4_4_ >> 0x18;
                      auVar26._8_4_ = auVar25._8_4_ >> 0x18;
                      auVar26._12_4_ = auVar25._12_4_ >> 0x18;
                      auVar26 = auVar26 | ~auVar25 & auVar30;
                      iVar33 = 0;
                      iVar37 = 0;
                      iVar31 = 0;
                      iVar32 = 0;
                      lVar20 = 0;
                      iVar19 = 0;
                      do {
                        iVar8 = (&g_etc1_inten_tables)
                                [(ulong)(this->m_best_solution).m_coords.m_inten_table * 4 +
                                 (ulong)(this->m_best_solution).m_selectors[lVar20]];
                        uVar16 = iVar8 + auVar26._0_4_;
                        uVar29 = 0xff;
                        if (0xfe < (int)uVar16) {
                          uVar16 = uVar29;
                        }
                        if ((int)uVar16 < 1) {
                          uVar16 = 0;
                        }
                        uVar23 = iVar8 + auVar26._4_4_;
                        if (0xfe < (int)uVar23) {
                          uVar23 = uVar29;
                        }
                        if ((int)uVar23 < 1) {
                          uVar23 = 0;
                        }
                        uVar21 = iVar8 + uVar18;
                        if (0xfe < (int)(iVar8 + uVar18)) {
                          uVar21 = uVar29;
                        }
                        if ((int)uVar21 < 1) {
                          uVar21 = 0;
                        }
                        iVar31 = iVar31 - auVar26._8_4_;
                        iVar32 = iVar32 - auVar26._12_4_;
                        iVar33 = uVar16 + (iVar33 - auVar26._0_4_);
                        iVar37 = uVar23 + (iVar37 - auVar26._4_4_);
                        iVar19 = (iVar19 - uVar18) + uVar21;
                        lVar20 = lVar20 + 1;
                      } while (uVar6 != (uint)lVar20);
                    }
                    auVar27._0_4_ = -(uint)(iVar33 == 0);
                    auVar27._4_4_ = -(uint)(iVar33 == 0);
                    auVar27._8_4_ = -(uint)(iVar37 == 0);
                    auVar27._12_4_ = -(uint)(iVar37 == 0);
                    uVar16 = movmskpd(uVar16,auVar27);
                    lVar20 = local_60;
                    if (((((uVar16 ^ 3) & 1) == 0) && ((byte)((byte)(uVar16 ^ 3) >> 1) == 0)) &&
                       (iVar19 == 0)) break;
                    auVar39._0_4_ = (float)iVar33;
                    auVar39._4_4_ = (float)iVar37;
                    auVar39._8_4_ = (float)iVar31;
                    auVar39._12_4_ = (float)iVar32;
                    auVar11._4_4_ = fStack_54;
                    auVar11._0_4_ = local_58;
                    auVar11._8_4_ = fStack_50;
                    auVar11._12_4_ = fStack_4c;
                    auVar24 = divps(auVar39,auVar11);
                    uVar16 = this->m_limit;
                    fVar34 = (float)(int)uVar16;
                    uVar2 = *(undefined8 *)(this->m_avg_color).m_s;
                    auVar36._0_4_ = fVar34 * ((float)uVar2 - auVar24._0_4_);
                    auVar36._4_4_ = fVar34 * ((float)((ulong)uVar2 >> 0x20) - auVar24._4_4_);
                    auVar36._8_4_ = fVar34 * (0.0 - auVar24._8_4_);
                    auVar36._12_4_ = fVar34 * (0.0 - auVar24._12_4_);
                    auVar24 = divps(auVar36,_DAT_001b0400);
                    fVar35 = auVar24._0_4_ + 0.5;
                    fVar38 = auVar24._4_4_ + 0.5;
                    uVar18 = (uint)fVar35;
                    uVar29 = (uint)fVar38;
                    uVar18 = (int)(fVar35 - 2.1474836e+09) & (int)uVar18 >> 0x1f | uVar18;
                    uVar29 = (int)(fVar38 - 2.1474836e+09) & (int)uVar29 >> 0x1f | uVar29;
                    uVar18 = ~-(uint)((int)uVar18 < 0) &
                             (~-(uint)((int)uVar18 < (int)uVar16) & uVar16 |
                             uVar18 & -(uint)((int)uVar18 < (int)uVar16));
                    uVar23 = ~-(uint)((int)uVar29 < 0) &
                             (~-(uint)((int)uVar29 < (int)uVar16) & uVar16 |
                             uVar29 & -(uint)((int)uVar29 < (int)uVar16));
                    uVar29 = (uint)(long)((((this->m_avg_color).m_s[2] - (float)iVar19 / local_48) *
                                          fVar34) / 255.0 + 0.5);
                    if ((int)uVar29 < (int)uVar16) {
                      uVar16 = uVar29;
                    }
                    if ((int)uVar29 < 0) {
                      uVar16 = 0;
                    }
                    if ((((uVar22 == uVar18) && (uVar15 == uVar23)) && (uVar14 == uVar16)) ||
                       (((uVar29 = uVar22, uVar18 == local_64 &&
                         (uVar29 = local_bc, uVar23 == local_bc)) &&
                        (uVar29 = (uint)bVar4, uVar16 == bVar4)))) break;
                    uVar1 = this->m_br;
                    uVar3 = this->m_bg;
                    auVar28._4_4_ = -(uint)(uVar1 == uVar18);
                    auVar28._0_4_ = -(uint)(uVar1 == uVar18);
                    auVar28._8_4_ = -(uint)(uVar3 == uVar23);
                    auVar28._12_4_ = -(uint)(uVar3 == uVar23);
                    uVar29 = movmskpd(uVar29,auVar28);
                    if ((((uVar29 & 1) != 0) && ((byte)((byte)uVar29 >> 1) != 0)) &&
                       (this->m_bb == uVar16)) break;
                    if ((int)uVar18 < 1) {
                      uVar18 = 0;
                    }
                    local_b0 = this->m_pParams->m_use_color4;
                    local_b8.field_0.r = (component_t)uVar18;
                    if (0xfe < (int)uVar18) {
                      local_b8.field_0.r = 0xff;
                    }
                    if ((int)uVar23 < 1) {
                      uVar23 = 0;
                    }
                    local_b8.field_0.g = (component_t)uVar23;
                    if (0xfe < (int)uVar23) {
                      local_b8.field_0.g = 0xff;
                    }
                    if ((int)uVar16 < 1) {
                      uVar16 = 0;
                    }
                    local_b8.field_0.b = (component_t)uVar16;
                    if (0xfe < (int)uVar16) {
                      local_b8.field_0.b = 0xff;
                    }
                    local_b8.field_0.a = 0xff;
                    local_b4 = 0;
                    if ((this->m_pParams->super_etc1_pack_params).m_quality == cHighQuality) {
                      bVar13 = evaluate_solution(this,(etc1_solution_coordinates *)&local_b8.field_0
                                                 ,local_98,local_a0);
                    }
                    else {
                      bVar13 = evaluate_solution_fast
                                         (this,(etc1_solution_coordinates *)&local_b8.field_0,
                                          local_98,local_a0);
                    }
                    lVar20 = local_60;
                    if ((bVar13 == false) || (iVar17 = iVar17 + 1, iVar17 == local_68)) break;
                  }
                }
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != local_80);
          }
          local_88 = local_88 + 1;
        } while (local_88 != local_80);
      }
      local_90 = local_90 + 1;
    } while (local_90 != local_80);
  }
  bVar13 = (this->m_best_solution).m_valid;
  if (bVar13 == false) {
    this->m_pResult->m_error = 0xffffffff;
  }
  else {
    prVar10 = this->m_pResult;
    prVar10->m_error = (this->m_best_solution).m_error;
    (prVar10->m_block_color_unscaled).field_0 =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0;
    prVar10 = this->m_pResult;
    prVar10->m_block_color4 = (this->m_best_solution).m_coords.m_color4;
    prVar10->m_block_inten_table = (this->m_best_solution).m_coords.m_inten_table;
    memcpy(prVar10->m_pSelectors,(this->m_best_solution).m_selectors,(ulong)uVar6);
    this->m_pResult->m_n = uVar6;
  }
  return bVar13;
}

Assistant:

bool etc1_optimizer::compute()
        {
            const uint n = m_pParams->m_num_src_pixels;
            const int scan_delta_size = m_pParams->m_scan_delta_size;

            // Scan through a subset of the 3D lattice centered around the avg block color trying each 3D (555 or 444) lattice point as a potential block color.
            // Each time a better solution is found try to refine the current solution's block color based of the current selectors and intensity table index.
            for (int zdi = 0; zdi < scan_delta_size; zdi++)
            {
                const int zd = m_pParams->m_pScan_deltas[zdi];
                const int mbb = m_bb + zd;
                if (mbb < 0)
                {
                    continue;
                }
                else if (mbb > m_limit)
                {
                    break;
                }

                for (int ydi = 0; ydi < scan_delta_size; ydi++)
                {
                    const int yd = m_pParams->m_pScan_deltas[ydi];
                    const int mbg = m_bg + yd;
                    if (mbg < 0)
                    {
                        continue;
                    }
                    else if (mbg > m_limit)
                    {
                        break;
                    }

                    for (int xdi = 0; xdi < scan_delta_size; xdi++)
                    {
                        const int xd = m_pParams->m_pScan_deltas[xdi];
                        const int mbr = m_br + xd;
                        if (mbr < 0)
                        {
                            continue;
                        }
                        else if (mbr > m_limit)
                        {
                            break;
                        }

                        etc1_solution_coordinates coords(mbr, mbg, mbb, 0, m_pParams->m_use_color4);
                        if (m_pParams->m_quality == cHighQuality)
                        {
                            if (!evaluate_solution(coords, m_trial_solution, &m_best_solution))
                            {
                                continue;
                            }
                        }
                        else
                        {
                            if (!evaluate_solution_fast(coords, m_trial_solution, &m_best_solution))
                            {
                                continue;
                            }
                        }

                        // Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
                        // Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
                        // The goal is:
                        // pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
                        // Rearranging this:
                        // (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
                        // block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
                        // So what this means:
                        // optimal_block_color = avg_input - avg_inten_delta
                        // So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
                        // Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
                        // Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

                        const uint max_refinement_trials = (m_pParams->m_quality == cLowQuality) ? 2 : (((xd | yd | zd) == 0) ? 4 : 2);
                        for (uint refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++)
                        {
                            const uint8* pSelectors = m_best_solution.m_selectors;
                            const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

                            int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
                            const color_quad_u8 base_color(m_best_solution.m_coords.get_scaled_color());
                            for (uint r = 0; r < n; r++)
                            {
                                const uint s = *pSelectors++;
                                const int yd = pInten_table[s];
                                // Compute actual delta being applied to each pixel, taking into account clamping.
                                delta_sum_r += rg_etc1::clamp<int>(base_color.r + yd, 0, 255) - base_color.r;
                                delta_sum_g += rg_etc1::clamp<int>(base_color.g + yd, 0, 255) - base_color.g;
                                delta_sum_b += rg_etc1::clamp<int>(base_color.b + yd, 0, 255) - base_color.b;
                            }
                            if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
                            {
                                break;
                            }
                            const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
                            const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
                            const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
                            const int br1 = rg_etc1::clamp<int>(static_cast<uint>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
                            const int bg1 = rg_etc1::clamp<int>(static_cast<uint>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
                            const int bb1 = rg_etc1::clamp<int>(static_cast<uint>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

                            bool skip = false;

                            if ((mbr == br1) && (mbg == bg1) && (mbb == bb1))
                            {
                                skip = true;
                            }
                            else if ((br1 == m_best_solution.m_coords.m_unscaled_color.r) && (bg1 == m_best_solution.m_coords.m_unscaled_color.g) && (bb1 == m_best_solution.m_coords.m_unscaled_color.b))
                            {
                                skip = true;
                            }
                            else if ((m_br == br1) && (m_bg == bg1) && (m_bb == bb1))
                            {
                                skip = true;
                            }

                            if (skip)
                            {
                                break;
                            }

                            etc1_solution_coordinates coords1(br1, bg1, bb1, 0, m_pParams->m_use_color4);
                            if (m_pParams->m_quality == cHighQuality)
                            {
                                if (!evaluate_solution(coords1, m_trial_solution, &m_best_solution))
                                {
                                    break;
                                }
                            }
                            else
                            {
                                if (!evaluate_solution_fast(coords1, m_trial_solution, &m_best_solution))
                                {
                                    break;
                                }
                            }

                        } // refinement_trial

                    } // xdi
                } // ydi
            } // zdi

            if (!m_best_solution.m_valid)
            {
                m_pResult->m_error = cUINT32_MAX;
                return false;
            }

            const uint8* pSelectors = m_best_solution.m_selectors;

#ifdef RG_ETC1_BUILD_DEBUG
            {
                color_quad_u8 block_colors[4];
                m_best_solution.m_coords.get_block_colors(block_colors);

                const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
                uint64 actual_error = 0;
                for (uint i = 0; i < n; i++)
                    actual_error += pSrc_pixels[i].squared_distance_rgb(block_colors[pSelectors[i]]);

                RG_ETC1_ASSERT(actual_error == m_best_solution.m_error);
            }
#endif

            m_pResult->m_error = m_best_solution.m_error;

            m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
            m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

            m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
            memcpy(m_pResult->m_pSelectors, pSelectors, n);
            m_pResult->m_n = n;

            return true;
        }